

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

void __thiscall
BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException
          (BmsParseInvalidRandomValueException *this,uint line,string *key,string *value)

{
  string *value_local;
  string *key_local;
  uint line_local;
  BmsParseInvalidRandomValueException *this_local;
  
  BmsParseException::BmsParseException(&this->super_BmsParseException,line);
  (this->super_BmsParseException).super_BmsException._vptr_BmsException =
       (_func_int **)&PTR_Message_abi_cxx11__001ab5d0;
  std::__cxx11::string::string((string *)&this->key_,(string *)key);
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  return;
}

Assistant:

BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException( unsigned int line,
                                                                          const std::string& key,
                                                                          const std::string& value ) :
BmsParseException( line ),
key_( key ),
value_( value )
{
}